

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_avx2.c
# Opt level: O0

int64_t summary_all_avx2(__m256i *sum_all)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  longlong in_RDX;
  longlong in_RSI;
  undefined1 (*in_RDI) [32];
  __m128i v;
  __m128i sum_1x64;
  __m128i sum_2x64;
  __m256i sum_4x64;
  __m256i sum1_4x64;
  __m256i sum0_4x64;
  __m256i zero;
  int64_t sum;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined1 auStack_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  int64_t local_190 [2];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined1 local_a0 [16];
  undefined1 local_90 [16];
  undefined1 local_80 [16];
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  local_180 = 0;
  uStack_178 = 0;
  uStack_170 = 0;
  uStack_168 = 0;
  local_140 = *(undefined8 *)*in_RDI;
  uStack_138 = *(undefined8 *)(*in_RDI + 8);
  uStack_130 = *(undefined8 *)(*in_RDI + 0x10);
  uStack_128 = *(undefined8 *)(*in_RDI + 0x18);
  local_160 = 0;
  uStack_158 = 0;
  uStack_150 = 0;
  uStack_148 = 0;
  auVar2 = vpunpckldq_avx2(*in_RDI,ZEXT1632(ZEXT816(0)));
  local_100 = *(undefined8 *)*in_RDI;
  uStack_f8 = *(undefined8 *)(*in_RDI + 8);
  uStack_f0 = *(undefined8 *)(*in_RDI + 0x10);
  uStack_e8 = *(undefined8 *)(*in_RDI + 0x18);
  local_120 = 0;
  uStack_118 = 0;
  uStack_110 = 0;
  uStack_108 = 0;
  auVar1 = vpunpckhdq_avx2(*in_RDI,ZEXT1632(ZEXT816(0)));
  local_1e0 = auVar2._0_8_;
  uStack_1d8 = auVar2._8_8_;
  uStack_1d0 = auVar2._16_8_;
  uStack_1c8 = auVar2._24_8_;
  local_200 = auVar1._0_8_;
  uStack_1f8 = auVar1._8_8_;
  uStack_1f0 = auVar1._16_8_;
  uStack_1e8 = auVar1._24_8_;
  local_c0 = local_1e0;
  uStack_b8 = uStack_1d8;
  uStack_b0 = uStack_1d0;
  uStack_a8 = uStack_1c8;
  local_e0 = local_200;
  uStack_d8 = uStack_1f8;
  uStack_d0 = uStack_1f0;
  uStack_c8 = uStack_1e8;
  auVar1 = vpaddq_avx2(auVar2,auVar1);
  local_220 = auVar1._0_8_;
  uStack_218 = auVar1._8_8_;
  auStack_210._0_8_ = auVar1._16_8_;
  auStack_210._8_8_ = auVar1._24_8_;
  local_60 = local_220;
  uStack_58 = uStack_218;
  uStack_50 = auStack_210._0_8_;
  uStack_48 = auStack_210._8_8_;
  uStack_68 = auStack_210._8_8_;
  local_70 = auStack_210._0_8_;
  auStack_210 = auVar1._16_16_;
  local_90 = vpaddq_avx(auStack_210,local_80);
  local_a0 = vpsrldq_avx(local_90,8);
  vpaddq_avx(local_90,local_a0);
  v[1] = in_RDX;
  v[0] = in_RSI;
  xx_storel_64(local_190,v);
  return local_190[0];
}

Assistant:

static inline int64_t summary_all_avx2(const __m256i *sum_all) {
  int64_t sum;
  __m256i zero = _mm256_setzero_si256();
  const __m256i sum0_4x64 = _mm256_unpacklo_epi32(*sum_all, zero);
  const __m256i sum1_4x64 = _mm256_unpackhi_epi32(*sum_all, zero);
  const __m256i sum_4x64 = _mm256_add_epi64(sum0_4x64, sum1_4x64);
  const __m128i sum_2x64 = _mm_add_epi64(_mm256_castsi256_si128(sum_4x64),
                                         _mm256_extracti128_si256(sum_4x64, 1));
  const __m128i sum_1x64 = _mm_add_epi64(sum_2x64, _mm_srli_si128(sum_2x64, 8));
  xx_storel_64(&sum, sum_1x64);
  return sum;
}